

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

string * __thiscall Node::OutputInteger_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char cVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar4 = (char)__return_storage_ptr__;
  if ((this->TextValue)._M_string_length == 0) {
LAB_0011e035:
    std::__cxx11::string::push_back(cVar4);
    return __return_storage_ptr__;
  }
  pcVar3 = (this->TextValue)._M_dataplus._M_p;
  bVar2 = false;
  uVar5 = 1;
  do {
    cVar1 = *pcVar3;
    if (cVar1 == '%') {
LAB_0011e01f:
      if ((this->TextValue)._M_string_length <= uVar5) {
        if (bVar2) {
          return __return_storage_ptr__;
        }
        goto LAB_0011e035;
      }
    }
    else {
      if (cVar1 != '0') {
        if (!bVar2 && cVar1 == '.') {
          std::__cxx11::string::push_back(cVar4);
        }
LAB_0011e00e:
        bVar2 = true;
        std::__cxx11::string::push_back(cVar4);
        goto LAB_0011e01f;
      }
      if (bVar2) goto LAB_0011e00e;
      bVar2 = false;
      if ((this->TextValue)._M_string_length <= uVar5) goto LAB_0011e035;
    }
    pcVar3 = (this->TextValue)._M_dataplus._M_p + uVar5;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

std::string Node::OutputInteger(void)
{
	int OFlag = 0;		// Have we output something yet?
	int Ptr = 0;		// What character are we looking at
	char ch;		// Actual character
	std::string result;		// Working string

	//
	// Output all digits in the string
	//
	while ((ch = TextValue[Ptr]), (Ptr < TextValue.length()))
	{
		Ptr++;
		if (ch == '0')
		{
			if (OFlag != 0)
			{
				result += ch;
			}
		}
		else
		{
			if (ch != '%')
			{
				if ((ch == '.') && (OFlag == 0))
				{
					result += '0';
				}
				result += ch;
				OFlag = 1;
			}
		}
	}

	//
	// If we didn't output anything, then output a zero
	// because it must have been all zeros.
	//
	if (OFlag == 0)
	{
		result += '0';
	}

	return result;
}